

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

QDomNodePrivate * __thiscall
QDomNodePrivate::removeChild(QDomNodePrivate *this,QDomNodePrivate *oldChild)

{
  undefined1 *puVar1;
  int iVar2;
  QDomNodePrivate *pQVar3;
  QDomNodePrivate *p;
  QDomNodePrivate *pQVar4;
  
  pQVar3 = (QDomNodePrivate *)0x0;
  if (((oldChild->field_0x98 & 2) != 0) && (pQVar4 = this, oldChild->ownerNode == this)) {
    while (iVar2 = (*pQVar4->_vptr_QDomNodePrivate[0xb])(pQVar4), iVar2 != 9) {
      puVar1 = &pQVar4->field_0x98;
      pQVar4 = pQVar4->ownerNode;
      if (((*puVar1 & 2) == 0) || (pQVar4 == (QDomNodePrivate *)0x0)) break;
    }
    if (pQVar4 != (QDomNodePrivate *)0x0) {
      pQVar4[1].prev = (QDomNodePrivate *)((long)&(pQVar4[1].prev)->_vptr_QDomNodePrivate + 1);
    }
    pQVar3 = oldChild->next;
    if (pQVar3 == (QDomNodePrivate *)0x0) {
      if ((oldChild->prev == (QDomNodePrivate *)0x0) && (this->first != oldChild)) {
        return (QDomNodePrivate *)0x0;
      }
    }
    else {
      pQVar3->prev = oldChild->prev;
    }
    pQVar4 = oldChild->prev;
    if (pQVar4 != (QDomNodePrivate *)0x0) {
      pQVar4->next = pQVar3;
    }
    if (this->last == oldChild) {
      this->last = pQVar4;
    }
    if (this->first == oldChild) {
      this->first = oldChild->next;
    }
    setNoParent(oldChild);
    oldChild->prev = (QDomNodePrivate *)0x0;
    oldChild->next = (QDomNodePrivate *)0x0;
    LOCK();
    (oldChild->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (oldChild->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    pQVar3 = oldChild;
  }
  return pQVar3;
}

Assistant:

QDomNodePrivate* QDomNodePrivate::removeChild(QDomNodePrivate* oldChild)
{
    // Error check
    if (oldChild->parent() != this)
        return nullptr;

    // "mark lists as dirty"
    QDomDocumentPrivate *const doc = ownerDocument();
    if (doc)
        doc->nodeListTime++;

    // Perhaps oldChild was just created with "createElement" or that. In this case
    // its parent is QDomDocument but it is not part of the documents child list.
    if (oldChild->next == nullptr && oldChild->prev == nullptr && first != oldChild)
        return nullptr;

    if (oldChild->next)
        oldChild->next->prev = oldChild->prev;
    if (oldChild->prev)
        oldChild->prev->next = oldChild->next;

    if (last == oldChild)
        last = oldChild->prev;
    if (first == oldChild)
        first = oldChild->next;

    oldChild->setNoParent();
    oldChild->next = nullptr;
    oldChild->prev = nullptr;

    // We are no longer interested in the old node
    oldChild->ref.deref();

    return oldChild;
}